

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  ImDrawCmd *pIVar1;
  char cVar2;
  ushort uVar3;
  ImDrawVert *__src;
  unsigned_short *__src_00;
  bool bVar4;
  ImDrawIdx *pIVar5;
  ImDrawVert *pIVar6;
  char *pcVar7;
  int iVar8;
  size_t sVar9;
  void *pvVar10;
  char *pcVar11;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  ImFontGlyph *pIVar12;
  int iVar13;
  ImDrawIdx IVar14;
  char *pcVar15;
  char *in_text;
  char *text_end_00;
  int iVar16;
  float fVar17;
  float fVar18;
  float in_XMM1_Dc;
  float fVar19;
  float in_XMM1_Dd;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  uint c;
  float local_ac;
  uint local_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  ImDrawIdx *local_78;
  ImDrawVert *local_70;
  int local_64;
  int local_60;
  ImU32 local_5c;
  ulong local_58;
  char *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar17 = pos.x;
  fVar18 = pos.y;
  local_5c = col;
  if (text_end == (char *)0x0) {
    fStack_80 = in_XMM1_Dc;
    local_88 = pos;
    fStack_7c = in_XMM1_Dd;
    sVar9 = strlen(text_begin);
    text_end = text_begin + sVar9;
    fVar17 = (float)local_88._0_4_;
    fVar18 = (float)local_88._4_4_;
    in_XMM1_Dc = fStack_80;
    in_XMM1_Dd = fStack_7c;
  }
  fVar22 = (float)(int)fVar18;
  fVar23 = (float)(int)fVar18;
  fVar24 = (float)(int)fVar18;
  local_98 = (float)(int)fVar18 + (this->DisplayOffset).y;
  fVar30 = clip_rect->w;
  if (local_98 <= fVar30) {
    fStack_44 = (float)(int)fVar18;
    fStack_40 = (float)(int)in_XMM1_Dc;
    fStack_3c = (float)(int)in_XMM1_Dd;
    local_48 = (float)(int)fVar17 + (this->DisplayOffset).x;
    fVar17 = size / this->FontSize;
    fVar18 = this->FontSize * fVar17;
    local_88._0_4_ = fVar18;
    fStack_94 = fVar22;
    fStack_90 = fVar23;
    fStack_8c = fVar24;
    if (wrap_width <= 0.0) {
      fVar18 = local_98 + fVar18;
      fVar19 = clip_rect->y;
      if ((fVar18 < fVar19) && (text_begin < text_end && fVar18 < fVar19)) {
        do {
          local_98 = fVar18;
          fStack_94 = fVar22;
          fStack_90 = fVar23;
          fStack_8c = fVar24;
          pvVar10 = memchr(text_begin,10,(long)text_end - (long)text_begin);
          text_begin = (char *)((long)pvVar10 + 1);
          if (pvVar10 == (void *)0x0) {
            text_begin = text_end;
          }
          fVar22 = 0.0;
          fVar23 = 0.0;
          fVar24 = 0.0;
          fVar18 = (float)local_88._0_4_ + local_98;
        } while ((fVar18 < fVar19) && (text_begin < text_end));
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) &&
       (pcVar11 = text_begin, fVar18 = local_98, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar11, fVar18 < fVar30 && (pcVar11 < text_end))) {
        pvVar10 = memchr(pcVar11,10,(long)text_end - (long)pcVar11);
        pcVar11 = (char *)((long)pvVar10 + 1);
        if (pvVar10 == (void *)0x0) {
          pcVar11 = text_end;
        }
        fVar18 = fVar18 + (float)local_88._0_4_;
      }
    }
    if (text_begin != text_end_00) {
      iVar8 = (int)text_end_00 - (int)text_begin;
      local_64 = iVar8 * 6;
      local_60 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_64,iVar8 * 4);
      local_70 = draw_list->_VtxWritePtr;
      local_78 = draw_list->_IdxWritePtr;
      local_58 = (ulong)draw_list->_VtxCurrentIdx;
      local_50 = (char *)0x0;
      fVar18 = local_48;
      fVar30 = local_48;
      fVar22 = (float)local_88._0_4_;
      fVar23 = local_98;
      fVar24 = fStack_94;
      fVar19 = fStack_90;
      fVar20 = fStack_8c;
      pcVar11 = local_50;
      fVar21 = local_48;
      pcVar15 = text_begin;
joined_r0x0013679a:
      do {
        if (text_end_00 <= text_begin) break;
        in_text = pcVar15;
        local_ac = fVar21;
        fVar28 = local_98;
        fVar27 = fStack_94;
        fVar25 = fStack_90;
        fVar26 = fStack_8c;
        pcVar7 = local_50;
        if (0.0 < wrap_width) {
          if (pcVar11 == (char *)0x0) {
            pcVar11 = CalcWordWrapPositionA
                                (this,fVar17,text_begin,text_end_00,(fVar30 - fVar18) + wrap_width);
            fVar24 = 0.0;
            fVar19 = 0.0;
            fVar20 = 0.0;
            pcVar11 = pcVar11 + (pcVar11 == text_begin);
            fVar30 = local_48;
            fVar22 = (float)local_88._0_4_;
          }
          in_text = text_begin;
          local_ac = fVar18;
          fVar28 = fVar23;
          fVar27 = fVar24;
          fVar25 = fVar19;
          fVar26 = fVar20;
          pcVar7 = pcVar11;
          if (pcVar11 <= text_begin) {
            do {
              if (text_end_00 <= text_begin) break;
              cVar2 = *text_begin;
              text_begin = text_begin + ((byte)(cVar2 - 9U) < 2 || cVar2 == ' ');
            } while ((cVar2 == ' ') || (cVar2 == '\t'));
            fVar18 = fVar30;
            fVar23 = fVar23 + fVar22;
            pcVar11 = (char *)0x0;
            goto joined_r0x0013679a;
          }
        }
        local_50 = pcVar7;
        fStack_8c = fVar26;
        fStack_90 = fVar25;
        fStack_94 = fVar27;
        local_98 = fVar28;
        local_9c = (uint)*in_text;
        if (*in_text < '\0') {
          iVar8 = ImTextCharFromUtf8(&local_9c,in_text,text_end_00);
          text_begin = in_text + iVar8;
          fVar30 = local_48;
          fVar22 = (float)local_88._0_4_;
          if (local_9c != 0) goto LAB_001368d6;
          bVar4 = true;
        }
        else {
          text_begin = in_text + 1;
LAB_001368d6:
          if (local_9c < 0x20) {
            if (local_9c != 0xd) {
              if (local_9c == 10) {
                local_98 = local_98 + fVar22;
                bVar4 = clip_rect->w <= local_98 && local_98 != clip_rect->w;
                local_ac = fVar30;
                goto LAB_00136999;
              }
              goto LAB_00136915;
            }
          }
          else {
LAB_00136915:
            if (((int)(local_9c & 0xffff) < (this->IndexLookup).Size) &&
               (uVar3 = (this->IndexLookup).Data[local_9c & 0xffff], uVar3 != 0xffff)) {
              pIVar12 = (ImFontGlyph *)
                        ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar3 * 0x28));
            }
            else {
              pIVar12 = this->FallbackGlyph;
            }
            bVar4 = true;
            if (pIVar12 == (ImFontGlyph *)0x0) {
              fVar18 = 0.0;
            }
            else {
              fVar18 = pIVar12->AdvanceX * fVar17;
              if ((local_9c != 9) && (local_9c != 0x20)) {
                fVar24 = pIVar12->X0 * fVar17 + local_ac;
                fVar23 = clip_rect->z;
                if (fVar24 <= fVar23) {
                  fVar20 = pIVar12->X1 * fVar17 + local_ac;
                  fVar19 = clip_rect->x;
                  if (fVar19 <= fVar20) {
                    fVar29 = pIVar12->Y0 * fVar17 + local_98;
                    fVar26 = pIVar12->Y1 * fVar17 + local_98;
                    fVar21 = pIVar12->U0;
                    fVar28 = pIVar12->V0;
                    fVar27 = pIVar12->U1;
                    fVar25 = pIVar12->V1;
                    if (cpu_fine_clip) {
                      if (fVar24 < fVar19) {
                        fVar21 = fVar21 + (fVar27 - fVar21) *
                                          (1.0 - (fVar20 - fVar19) / (fVar20 - fVar24));
                        fVar24 = fVar19;
                      }
                      fVar19 = clip_rect->y;
                      if (fVar29 < fVar19) {
                        fVar28 = fVar28 + (fVar25 - fVar28) *
                                          (1.0 - (fVar26 - fVar19) / (fVar26 - fVar29));
                        fVar29 = fVar19;
                      }
                      if (fVar23 < fVar20) {
                        fVar27 = (fVar27 - fVar21) * ((fVar23 - fVar24) / (fVar20 - fVar24)) +
                                 fVar21;
                        fVar20 = fVar23;
                      }
                      fVar23 = clip_rect->w;
                      if (fVar23 < fVar26) {
                        fVar25 = (fVar25 - fVar28) * ((fVar23 - fVar29) / (fVar26 - fVar29)) +
                                 fVar28;
                        fVar26 = fVar23;
                      }
                      if (fVar26 <= fVar29) {
                        local_ac = local_ac + fVar18;
                        bVar4 = false;
                        goto LAB_00136988;
                      }
                    }
                    IVar14 = (ImDrawIdx)local_58;
                    *local_78 = IVar14;
                    local_78[1] = IVar14 + 1;
                    local_78[2] = IVar14 + 2;
                    local_78[3] = IVar14;
                    local_78[4] = IVar14 + 2;
                    local_78[5] = IVar14 + 3;
                    (local_70->pos).x = fVar24;
                    (local_70->pos).y = fVar29;
                    local_70->col = local_5c;
                    (local_70->uv).x = fVar21;
                    (local_70->uv).y = fVar28;
                    local_70[1].pos.x = fVar20;
                    local_70[1].pos.y = fVar29;
                    local_70[1].col = local_5c;
                    local_70[1].uv.x = fVar27;
                    local_70[1].uv.y = fVar28;
                    local_70[2].pos.x = fVar20;
                    local_70[2].pos.y = fVar26;
                    local_70[2].col = local_5c;
                    local_70[2].uv.x = fVar27;
                    local_70[2].uv.y = fVar25;
                    local_70[3].pos.x = fVar24;
                    local_70[3].pos.y = fVar26;
                    local_70[3].col = local_5c;
                    local_70[3].uv.x = fVar21;
                    local_70[3].uv.y = fVar25;
                    local_70 = local_70 + 4;
                    local_58 = (ulong)((int)local_58 + 4);
                    local_78 = local_78 + 6;
                  }
                }
              }
            }
LAB_00136988:
            if (bVar4) {
              local_ac = local_ac + fVar18;
            }
          }
          bVar4 = false;
        }
LAB_00136999:
        fVar18 = local_ac;
        fVar23 = local_98;
        fVar24 = fStack_94;
        fVar19 = fStack_90;
        fVar20 = fStack_8c;
        pcVar11 = local_50;
        fVar21 = local_ac;
        pcVar15 = text_begin;
      } while (!bVar4);
      pIVar6 = local_70;
      pIVar5 = local_78;
      iVar16 = (int)((ulong)((long)local_70 - (long)(draw_list->VtxBuffer).Data) >> 2);
      iVar13 = iVar16 * -0x33333333;
      iVar8 = (draw_list->VtxBuffer).Capacity;
      if (SBORROW4(iVar8,iVar13) != iVar8 + iVar16 * 0x33333333 < 0) {
        if (iVar8 == 0) {
          iVar16 = 8;
        }
        else {
          iVar16 = iVar8 / 2 + iVar8;
        }
        if (iVar16 <= iVar13) {
          iVar16 = iVar13;
        }
        if (iVar8 < iVar16) {
          __dest = (ImDrawVert *)ImGui::MemAlloc((long)iVar16 * 0x14);
          __src = (draw_list->VtxBuffer).Data;
          if (__src != (ImDrawVert *)0x0) {
            memcpy(__dest,__src,(long)(draw_list->VtxBuffer).Size * 0x14);
            ImGui::MemFree((draw_list->VtxBuffer).Data);
          }
          (draw_list->VtxBuffer).Data = __dest;
          (draw_list->VtxBuffer).Capacity = iVar16;
        }
      }
      (draw_list->VtxBuffer).Size = iVar13;
      iVar8 = (draw_list->IdxBuffer).Capacity;
      iVar16 = (int)((ulong)((long)pIVar5 - (long)(draw_list->IdxBuffer).Data) >> 1);
      if (iVar8 < iVar16) {
        if (iVar8 == 0) {
          iVar13 = 8;
        }
        else {
          iVar13 = iVar8 / 2 + iVar8;
        }
        if (iVar13 <= iVar16) {
          iVar13 = iVar16;
        }
        if (iVar8 < iVar13) {
          __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar13 * 2);
          __src_00 = (draw_list->IdxBuffer).Data;
          if (__src_00 != (unsigned_short *)0x0) {
            memcpy(__dest_00,__src_00,(long)(draw_list->IdxBuffer).Size * 2);
            ImGui::MemFree((draw_list->IdxBuffer).Data);
          }
          (draw_list->IdxBuffer).Data = __dest_00;
          (draw_list->IdxBuffer).Capacity = iVar13;
        }
      }
      (draw_list->IdxBuffer).Size = iVar16;
      pIVar1 = (draw_list->CmdBuffer).Data + (long)(draw_list->CmdBuffer).Size + -1;
      pIVar1->ElemCount = pIVar1->ElemCount + (iVar16 - (local_60 + local_64));
      draw_list->_VtxWritePtr = pIVar6;
      draw_list->_IdxWritePtr = pIVar5;
      draw_list->_VtxCurrentIdx = (draw_list->VtxBuffer).Size;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const ImFontGlyph* glyph = FindGlyph((ImWchar)c))
        {
            char_width = glyph->AdvanceX * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = (unsigned int)draw_list->VtxBuffer.Size;
}